

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Source.cpp
# Opt level: O0

void __thiscall helics::apps::Source::runTo(Source *this,Time stopTime_input)

{
  bool bVar1;
  element_type *peVar2;
  Time TVar3;
  ostream *this_00;
  ostream *poVar4;
  TimeRepresentation<count_time<9,_long>_> in_RDI;
  double dVar5;
  Time nextPrintTime;
  SourceObject *src;
  iterator __end3;
  iterator __begin3;
  deque<helics::apps::SourceObject,_std::allocator<helics::apps::SourceObject>_> *__range3;
  Time currentTime;
  Time nextRequestTime;
  Modes md;
  deque<helics::apps::SourceObject,_std::allocator<helics::apps::SourceObject>_>
  *in_stack_ffffffffffffff08;
  undefined7 in_stack_ffffffffffffff10;
  undefined1 in_stack_ffffffffffffff17;
  undefined1 uVar6;
  TimeRepresentation<count_time<9,_long>_> local_e0;
  baseType local_d8;
  baseType local_d0;
  baseType local_c8;
  baseType local_c0;
  TimeRepresentation<count_time<9,_long>_> local_b8;
  baseType local_b0;
  TimeRepresentation<count_time<9,_long>_> local_a8;
  reference local_a0;
  _Self local_98;
  undefined7 in_stack_ffffffffffffff90;
  IterationRequest in_stack_ffffffffffffff97;
  Time in_stack_ffffffffffffff98;
  TimeRepresentation<count_time<9,_long>_> in_stack_ffffffffffffffd0;
  Time in_stack_ffffffffffffffd8;
  TimeRepresentation<count_time<9,_long>_> local_20;
  Modes local_11;
  TimeRepresentation<count_time<9,_long>_> local_8;
  
  CLI::std::
  __shared_ptr_access<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x23837d);
  local_11 = Federate::getCurrentMode((Federate *)0x23838c);
  if (local_11 == STARTUP) {
    (**(code **)(((TimeRepresentation<count_time<9,_long>_> *)in_RDI.internalTimeCode)->
                 internalTimeCode + 0x10))();
  }
  local_20.internalTimeCode = 0x7fffffffffffffff;
  if (local_11 == EXECUTING) {
    peVar2 = CLI::std::
             __shared_ptr_access<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x238474);
    TVar3 = Federate::getCurrentTime
                      ((Federate *)
                       ((long)&(peVar2->super_ValueFederate)._vptr_ValueFederate +
                       (long)(peVar2->super_ValueFederate)._vptr_ValueFederate[-3]));
    CLI::std::deque<helics::apps::SourceObject,_std::allocator<helics::apps::SourceObject>_>::begin
              (in_stack_ffffffffffffff08);
    CLI::std::deque<helics::apps::SourceObject,_std::allocator<helics::apps::SourceObject>_>::end
              (in_stack_ffffffffffffff08);
    while (bVar1 = CLI::std::operator==((_Self *)&stack0xffffffffffffff88,&local_98),
          local_b0 = TVar3.internalTimeCode, ((bVar1 ^ 0xffU) & 1) != 0) {
      local_a0 = CLI::std::
                 _Deque_iterator<helics::apps::SourceObject,_helics::apps::SourceObject_&,_helics::apps::SourceObject_*>
                 ::operator*((_Deque_iterator<helics::apps::SourceObject,_helics::apps::SourceObject_&,_helics::apps::SourceObject_*>
                              *)&stack0xffffffffffffff88);
      bVar1 = TimeRepresentation<count_time<9,_long>_>::operator<(&local_a0->nextTime,&local_20);
      if (bVar1) {
        local_20.internalTimeCode = (local_a0->nextTime).internalTimeCode;
      }
      CLI::std::
      _Deque_iterator<helics::apps::SourceObject,_helics::apps::SourceObject_&,_helics::apps::SourceObject_*>
      ::operator++((_Deque_iterator<helics::apps::SourceObject,_helics::apps::SourceObject_&,_helics::apps::SourceObject_*>
                    *)CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10));
    }
  }
  else {
    in_stack_ffffffffffffffd0 =
         TimeRepresentation<count_time<9,_long>_>::operator-
                   (in_RDI.internalTimeCode,
                    (TimeRepresentation<count_time<9,_long>_> *)
                    CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10));
    runSourceLoop((Source *)in_stack_ffffffffffffffd0.internalTimeCode,in_stack_ffffffffffffffd8);
    CLI::std::
    __shared_ptr_access<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x238408);
    Federate::enterExecutingMode
              ((Federate *)in_stack_ffffffffffffff98.internalTimeCode,in_stack_ffffffffffffff97);
    local_20.internalTimeCode =
         (baseType)
         runSourceLoop(in_stack_ffffffffffffffd0.internalTimeCode,in_stack_ffffffffffffffd8);
    local_b0 = 0;
  }
  local_a8 = ::operator+(in_RDI,(double)CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10
                                                ));
  while( true ) {
    local_b8 = TimeRepresentation<count_time<9,_long>_>::maxVal();
    bVar1 = TimeRepresentation<count_time<9,_long>_>::operator<(&local_20,&local_b8);
    uVar6 = false;
    if (bVar1) {
      uVar6 = TimeRepresentation<count_time<9,_long>_>::operator<=(&local_20,&local_8);
    }
    if ((bool)uVar6 == false) break;
    CLI::std::
    __shared_ptr_access<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x2385cd);
    local_c8 = local_20.internalTimeCode;
    local_d8 = (baseType)
               Federate::requestTime
                         ((Federate *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
                          in_stack_ffffffffffffff98);
    local_c0 = local_d8;
    local_d0 = (baseType)runSourceLoop(in_stack_ffffffffffffffd0.internalTimeCode,(Time)local_d8);
    local_20.internalTimeCode = local_d0;
    bVar1 = TimeRepresentation<count_time<9,_long>_>::operator>=
                      ((TimeRepresentation<count_time<9,_long>_> *)&stack0xffffffffffffffd8,
                       &local_a8);
    if (bVar1) {
      this_00 = std::operator<<((ostream *)&std::cout,"processed time ");
      dVar5 = TimeRepresentation::operator_cast_to_double
                        ((TimeRepresentation<count_time<9,_long>_> *)0x23866a);
      poVar4 = (ostream *)std::ostream::operator<<(this_00,dVar5);
      std::operator<<(poVar4,"\n");
      TimeRepresentation<count_time<9,_long>_>::TimeRepresentation
                ((TimeRepresentation<count_time<9,_long>_> *)
                 CONCAT17(uVar6,in_stack_ffffffffffffff10),(double)this_00);
      TimeRepresentation<count_time<9,_long>_>::operator+=(&local_a8,&local_e0);
    }
  }
  return;
}

Assistant:

void Source::runTo(Time stopTime_input)
    {
        auto md = fed->getCurrentMode();
        if (md == Federate::Modes::STARTUP) {
            initialize();
        }
        Time nextRequestTime = Time::maxVal();
        Time currentTime;
        if (md != Federate::Modes::EXECUTING) {
            // send stuff before timeZero

            runSourceLoop(timeZero - timeEpsilon);

            fed->enterExecutingMode();
            // send the stuff at timeZero
            nextRequestTime = runSourceLoop(timeZero);
            currentTime = timeZero;
        } else {
            currentTime = fed->getCurrentTime();

            for (auto& src : sources) {
                if (src.nextTime < nextRequestTime) {
                    nextRequestTime = src.nextTime;
                }
            }
        }
        helics::Time nextPrintTime = currentTime + 10.0;
        while ((nextRequestTime < Time::maxVal()) && (nextRequestTime <= stopTime_input)) {
            currentTime = fed->requestTime(nextRequestTime);
            nextRequestTime = runSourceLoop(currentTime);
            if (currentTime >= nextPrintTime) {
                std::cout << "processed time " << static_cast<double>(currentTime) << "\n";
                nextPrintTime += 10.0;
            }
        }
    }